

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O3

void __thiscall glu::Texture1DArray::upload(Texture1DArray *this)

{
  code *pcVar1;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TransferFormat TVar6;
  pointer pPVar7;
  TestError *this_00;
  pointer pPVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar5;
  
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  if (this->m_glTexture != 0) {
    (**(code **)(lVar5 + 0xb8))(0x8c18);
    pcVar1 = *(code **)(lVar5 + 0xff0);
    uVar3 = tcu::TextureFormat::getPixelSize((TextureFormat *)&this->m_refTexture);
    uVar9 = 8;
    if ((int)uVar3 < 8) {
      uVar9 = uVar3;
    }
    uVar11 = 1;
    if ((uVar3 & uVar3 - 1) == 0) {
      uVar11 = uVar9;
    }
    (*pcVar1)(0xcf5,uVar11);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    checkError(dVar4,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x1fe);
    TVar6 = getTransferFormat((this->m_refTexture).super_TextureLevelPyramid.m_format);
    pPVar7 = (this->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar8 = (this->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)pPVar8 - (long)pPVar7) >> 3) * -0x33333333) {
      lVar10 = 8;
      uVar12 = 0;
      lVar13 = 8;
      do {
        if (*(long *)((long)&((this->m_refTexture).super_TextureLevelPyramid.m_data.
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar13) != 0) {
          (**(code **)(lVar5 + 0x1310))
                    (0x8c18,uVar12 & 0xffffffff,this->m_format,
                     *(undefined4 *)
                      ((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data + lVar10 + -8),
                     *(undefined4 *)
                      ((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data + lVar10 + -4),0,
                     TVar6,(ulong)TVar6 >> 0x20,
                     *(undefined8 *)
                      ((long)(pPVar7->super_ConstPixelBufferAccess).m_pitch.m_data + lVar10 + 4));
          pPVar7 = (this->m_refTexture).super_TextureLevelPyramid.m_access.
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar8 = (this->m_refTexture).super_TextureLevelPyramid.m_access.
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 0x10;
        lVar10 = lVar10 + 0x28;
      } while ((long)uVar12 < (long)((int)((ulong)((long)pPVar8 - (long)pPVar7) >> 3) * -0x33333333)
              );
    }
    dVar4 = (**(code **)(lVar5 + 0x800))();
    checkError(dVar4,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x20c);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_glTexture",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x1fb);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Texture1DArray::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_1D_ARRAY, m_glTexture);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(m_refTexture.getFormat()));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");

	TransferFormat transferFormat = getTransferFormat(m_refTexture.getFormat());

	for (int levelNdx = 0; levelNdx < m_refTexture.getNumLevels(); levelNdx++)
	{
		if (m_refTexture.isLevelEmpty(levelNdx))
			continue; // Don't upload.

		tcu::ConstPixelBufferAccess access = m_refTexture.getLevel(levelNdx);
		DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*access.getWidth());
		gl.texImage2D(GL_TEXTURE_1D_ARRAY, levelNdx, m_format, access.getWidth(), access.getHeight(), 0 /* border */, transferFormat.format, transferFormat.dataType, access.getDataPtr());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}